

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  uint uVar1;
  uint uVar2;
  ImDrawVert *pIVar3;
  uint uVar4;
  uint uVar5;
  unsigned_short *puVar6;
  ImVec2 *p;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ImVec2 triangle [3];
  ImVec2 local_70;
  ImRect local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (show_mesh || show_aabb) {
    if ((draw_list->IdxBuffer).Size < 1) {
      puVar6 = (unsigned_short *)0x0;
    }
    else {
      puVar6 = (draw_list->IdxBuffer).Data;
    }
    uVar1 = draw_cmd->VtxOffset;
    pIVar3 = (draw_list->VtxBuffer).Data;
    local_58._0_4_ = (draw_cmd->ClipRect).x;
    local_58._4_4_ = (draw_cmd->ClipRect).y;
    uStack_50 = 0;
    local_48._0_4_ = (draw_cmd->ClipRect).z;
    local_48._4_4_ = (draw_cmd->ClipRect).w;
    uStack_40 = 0;
    local_68.Min.x = 3.4028235e+38;
    local_68.Min.y = 3.4028235e+38;
    local_68.Max.x = -3.4028235e+38;
    local_68.Max.y = -3.4028235e+38;
    uVar2 = out_draw_list->Flags;
    out_draw_list->Flags = uVar2 & 0xfffffffe;
    uVar4 = draw_cmd->IdxOffset;
    uVar5 = uVar4;
    while (uVar5 < uVar4 + draw_cmd->ElemCount) {
      triangle[0].x = 0.0;
      triangle[0].y = 0.0;
      triangle[1].x = 0.0;
      triangle[1].y = 0.0;
      triangle[2].x = 0.0;
      triangle[2].y = 0.0;
      for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 8) {
        uVar4 = uVar5;
        if (puVar6 != (unsigned_short *)0x0) {
          uVar4 = (uint)puVar6[uVar5];
        }
        p = (ImVec2 *)((long)&triangle[0].x + lVar7);
        *p = pIVar3[(ulong)uVar1 + (ulong)uVar4].pos;
        ImRect::Add(&local_68,p);
        uVar5 = uVar5 + 1;
      }
      if (show_mesh) {
        ImDrawList::AddPolyline(out_draw_list,triangle,3,0xff00ffff,true,1.0);
      }
      uVar4 = draw_cmd->IdxOffset;
    }
    if (show_aabb) {
      auVar8._0_4_ = (int)(float)local_58;
      auVar8._4_4_ = (int)local_58._4_4_;
      auVar8._8_4_ = (int)(float)uStack_50;
      auVar8._12_4_ = (int)uStack_50._4_4_;
      auVar8 = vcvtdq2ps_avx(auVar8);
      triangle[0] = (ImVec2)vmovlps_avx(auVar8);
      auVar9._0_4_ = (int)(float)local_48;
      auVar9._4_4_ = (int)local_48._4_4_;
      auVar9._8_4_ = (int)(float)uStack_40;
      auVar9._12_4_ = (int)uStack_40._4_4_;
      auVar8 = vcvtdq2ps_avx(auVar9);
      local_70 = (ImVec2)vmovlps_avx(auVar8);
      ImDrawList::AddRect(out_draw_list,triangle,&local_70,0xffff00ff,0.0,0xf,1.0);
      auVar10._0_4_ = (int)local_68.Min.x;
      auVar10._4_4_ = (int)local_68.Min.y;
      auVar10._8_8_ = 0;
      auVar8 = vcvtdq2ps_avx(auVar10);
      triangle[0] = (ImVec2)vmovlps_avx(auVar8);
      auVar11._0_4_ = (int)local_68.Max.x;
      auVar11._4_4_ = (int)local_68.Max.y;
      auVar11._8_8_ = 0;
      auVar8 = vcvtdq2ps_avx(auVar11);
      local_70 = (ImVec2)vmovlps_avx(auVar8);
      ImDrawList::AddRect(out_draw_list,triangle,&local_70,0xffffff00,0.0,0xf,1.0);
    }
    out_draw_list->Flags = uVar2;
    return;
  }
  __assert_fail("show_mesh || show_aabb",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x2bc9,
                "void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, bool, bool)"
               );
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);
    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
    ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset; idx_n < draw_cmd->IdxOffset + draw_cmd->ElemCount; )
    {
        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}